

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callbacks.cpp
# Opt level: O0

IDeckLinkScreenPreviewCallback *
cdecklink_internal_callback_create_deck_link_screen_preview_callback
          (void *ctx,cdecklink_screen_preview_callback_draw_frame *cb0)

{
  cdecklink_screen_preview_callback_draw_frame *cb0_local;
  void *ctx_local;
  
  if (cb0 == (cdecklink_screen_preview_callback_draw_frame *)0x0) {
    ctx_local = (void *)0x0;
  }
  else {
    ctx_local = operator_new(0x20);
    DeckLinkScreenPreviewCallback::DeckLinkScreenPreviewCallback
              ((DeckLinkScreenPreviewCallback *)ctx_local,ctx,cb0);
  }
  return (IDeckLinkScreenPreviewCallback *)ctx_local;
}

Assistant:

IDeckLinkScreenPreviewCallback* cdecklink_internal_callback_create_deck_link_screen_preview_callback (void *ctx, cdecklink_screen_preview_callback_draw_frame *cb0) {
	if (cb0 != nullptr) {
		return new DeckLinkScreenPreviewCallback(ctx, cb0);
	}
	return nullptr;
}